

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PipelineExecutor::PipelineExecutor
          (PipelineExecutor *this,ClientContext *context_p,Pipeline *pipeline_p)

{
  ExecutionContext *pEVar1;
  PhysicalOperator *pPVar2;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var3;
  pointer puVar4;
  _Head_base<0UL,_duckdb::LocalSourceState_*,_false> _Var5;
  PhysicalOperator *pPVar6;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var7;
  int iVar8;
  pointer pLVar9;
  idx_t index;
  type pGVar10;
  optional_ptr<duckdb::PhysicalOperator,_true> *poVar11;
  reference pvVar12;
  DataChunk *this_00;
  pointer this_01;
  Allocator *allocator;
  pointer pGVar13;
  size_type __n;
  Pipeline *pPVar14;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_78;
  pointer local_70;
  pointer puStack_68;
  pointer local_60;
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> *local_58;
  vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
  *local_50;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  *local_48;
  DataChunk *local_40;
  _Head_base<0UL,_duckdb::OperatorState_*,_false> local_38;
  
  this->pipeline = pipeline_p;
  ThreadContext::ThreadContext(&this->thread,context_p);
  (this->context).client = context_p;
  (this->context).thread = &this->thread;
  (this->context).pipeline.ptr = pipeline_p;
  local_48 = (vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
              *)&this->intermediate_chunks;
  local_50 = (vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
              *)&this->intermediate_states;
  local_58 = &this->local_sink_state;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_chunks).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->intermediate_states).
  super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl = (LocalSourceState *)0x0;
  (this->local_sink_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  InterruptState::InterruptState(&this->interrupt_state);
  local_40 = &this->final_chunk;
  DataChunk::DataChunk(local_40);
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->in_process_operators).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &this->in_process_operators,0);
  pEVar1 = &this->context;
  this->finalized = false;
  this->finished_processing_idx = -1;
  (this->required_partition_info).batch_index = false;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->required_partition_info).partition_columns.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->required_partition_info).partition_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  this->should_flush_current_idx = true;
  if ((this->pipeline->sink).ptr != (PhysicalOperator *)0x0) {
    poVar11 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar11);
    pPVar2 = poVar11->ptr;
    (*pPVar2->_vptr_PhysicalOperator[0x1f])(&local_78,pPVar2,pEVar1);
    _Var7._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (LocalSinkState *)0x0;
    _Var3._M_head_impl =
         (local_58->
         super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
         .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
    (local_58->
    super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
    super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var3._M_head_impl != (LocalSinkState *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LocalSinkState + 8))();
      if (local_78._M_head_impl != (LocalSinkState *)0x0) {
        (*(local_78._M_head_impl)->_vptr_LocalSinkState[1])();
      }
    }
    poVar11 = &this->pipeline->sink;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar11);
    (*poVar11->ptr->_vptr_PhysicalOperator[0x23])(&local_78);
    (this->required_partition_info).batch_index = local_78._M_head_impl._0_1_;
    puVar4 = (this->required_partition_info).partition_columns.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = local_70;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_68;
    (this->required_partition_info).partition_columns.
    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_60;
    local_70 = (pointer)0x0;
    puStack_68 = (pointer)0x0;
    local_60 = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
      if (local_70 != (pointer)0x0) {
        operator_delete(local_70);
      }
    }
    if (((this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->required_partition_info).partition_columns.
         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) ||
       (((this->required_partition_info).batch_index & 1U) != 0)) {
      pLVar9 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
               ::operator->(local_58);
      index = Pipeline::RegisterNewBatchIndex(this->pipeline);
      optional_idx::optional_idx((optional_idx *)&local_78,index);
      (pLVar9->partition_info).batch_index.index = (idx_t)local_78._M_head_impl;
      (pLVar9->partition_info).min_batch_index.index = (idx_t)local_78._M_head_impl;
    }
  }
  poVar11 = &this->pipeline->source;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar11);
  pPVar2 = poVar11->ptr;
  pGVar10 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
            ::operator*(&this->pipeline->source_state);
  (*pPVar2->_vptr_PhysicalOperator[0xf])(&local_78,pPVar2,pEVar1,pGVar10);
  _Var3._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (LocalSinkState *)0x0;
  _Var5._M_head_impl =
       (this->local_source_state).
       super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
       .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl;
  (this->local_source_state).
  super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSourceState_*,_std::default_delete<duckdb::LocalSourceState>_>
  .super__Head_base<0UL,_duckdb::LocalSourceState_*,_false>._M_head_impl =
       (LocalSourceState *)_Var3._M_head_impl;
  if (_Var5._M_head_impl != (LocalSourceState *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_LocalSourceState[1])();
    if ((DataChunk *)local_78._M_head_impl != (DataChunk *)0x0) {
      (**(code **)((long)(((vector<duckdb::Vector,_true> *)
                          &(local_78._M_head_impl)->_vptr_LocalSinkState)->
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>).
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::reserve(local_48,(long)(this->pipeline->operators).
                           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->pipeline->operators).
                           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           .
                           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
             *)local_50,
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->pipeline->operators).
                  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  pPVar14 = this->pipeline;
  if ((pPVar14->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pPVar14->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      if (__n == 0) {
        poVar11 = &pPVar14->source;
        optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(poVar11);
      }
      else {
        poVar11 = (optional_ptr<duckdb::PhysicalOperator,_true> *)
                  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                            (&pPVar14->operators,__n - 1);
      }
      pPVar2 = poVar11->ptr;
      pvVar12 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                          (&this->pipeline->operators,__n);
      pPVar6 = pvVar12->_M_data;
      this_00 = (DataChunk *)operator_new(0x40);
      DataChunk::DataChunk(this_00);
      local_78._M_head_impl = (LocalSinkState *)this_00;
      this_01 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&local_78);
      allocator = Allocator::Get(pEVar1->client);
      DataChunk::Initialize(this_01,allocator,&pPVar2->types,0x800);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)local_48,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &local_78);
      (*pPVar6->_vptr_PhysicalOperator[8])(&local_38,pPVar6,pEVar1);
      ::std::
      vector<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>,std::allocator<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::OperatorState,std::default_delete<duckdb::OperatorState>,true>>
                (local_50,(unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                           *)&local_38);
      iVar8 = (*pPVar6->_vptr_PhysicalOperator[0x21])(pPVar6);
      if ((char)iVar8 != '\0') {
        pGVar13 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator->(&pPVar6->sink_state);
        if (pGVar13->state == NO_OUTPUT_POSSIBLE) {
          FinishProcessing(this,-1);
        }
      }
      if (local_38._M_head_impl != (OperatorState *)0x0) {
        (*(local_38._M_head_impl)->_vptr_OperatorState[1])();
      }
      _Var3._M_head_impl = local_78._M_head_impl;
      if ((DataChunk *)local_78._M_head_impl != (DataChunk *)0x0) {
        DataChunk::~DataChunk((DataChunk *)local_78._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      __n = __n + 1;
      pPVar14 = this->pipeline;
    } while (__n < (ulong)((long)(pPVar14->operators).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pPVar14->operators).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  InitializeChunk(this,local_40);
  return;
}

Assistant:

PipelineExecutor::PipelineExecutor(ClientContext &context_p, Pipeline &pipeline_p)
    : pipeline(pipeline_p), thread(context_p), context(context_p, thread, &pipeline_p) {
	D_ASSERT(pipeline.source_state);
	if (pipeline.sink) {
		local_sink_state = pipeline.sink->GetLocalSinkState(context);
		required_partition_info = pipeline.sink->RequiredPartitionInfo();
		if (required_partition_info.AnyRequired()) {
			D_ASSERT(pipeline.source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex()));
			auto &partition_info = local_sink_state->partition_info;
			D_ASSERT(!partition_info.batch_index.IsValid());
			// batch index is not set yet - initialize before fetching anything
			partition_info.batch_index = pipeline.RegisterNewBatchIndex();
			partition_info.min_batch_index = partition_info.batch_index;
		}
	}
	local_source_state = pipeline.source->GetLocalSourceState(context, *pipeline.source_state);

	intermediate_chunks.reserve(pipeline.operators.size());
	intermediate_states.reserve(pipeline.operators.size());
	for (idx_t i = 0; i < pipeline.operators.size(); i++) {
		auto &prev_operator = i == 0 ? *pipeline.source : pipeline.operators[i - 1].get();
		auto &current_operator = pipeline.operators[i].get();

		auto chunk = make_uniq<DataChunk>();
		chunk->Initialize(Allocator::Get(context.client), prev_operator.GetTypes());
		intermediate_chunks.push_back(std::move(chunk));

		auto op_state = current_operator.GetOperatorState(context);
		intermediate_states.push_back(std::move(op_state));

		if (current_operator.IsSink() && current_operator.sink_state->state == SinkFinalizeType::NO_OUTPUT_POSSIBLE) {
			// one of the operators has already figured out no output is possible
			// we can skip executing the pipeline
			FinishProcessing();
		}
	}
	InitializeChunk(final_chunk);
}